

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  undefined8 *puVar1;
  Parse *pParse_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FuncDef *zArg1;
  undefined4 uVar5;
  byte *in_RSI;
  long in_RDI;
  bool bVar6;
  bool bVar7;
  int nRef;
  NameContext *pNC2;
  u8 enc;
  FuncDef *pDef;
  char *zId;
  int nId;
  int auth;
  int is_agg;
  int wrong_num_args;
  int no_such_func;
  int n;
  ExprList *pList;
  Expr *pRight;
  char *zDb;
  char *zTable;
  char *zColumn;
  Parse *pParse;
  NameContext *pNC;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar8;
  undefined4 in_stack_ffffffffffffff74;
  Expr *in_stack_ffffffffffffff78;
  undefined8 *puVar9;
  undefined7 in_stack_ffffffffffffff80;
  u8 uVar10;
  char *z;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar11;
  Expr *pExpr_00;
  undefined8 in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  sqlite3 *in_stack_ffffffffffffffc8;
  int local_4;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x28);
  pParse_00 = (Parse *)*puVar1;
  if ((*(uint *)(in_RSI + 4) & 4) != 0) {
    return 1;
  }
  *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 4;
  uVar2 = (uint)*in_RSI;
  if (uVar2 != 0x14) {
    if (uVar2 == 0x1b) {
      iVar8 = lookupName((Parse *)pList,_no_such_func,_is_agg,_nId,(NameContext *)zId,(Expr *)pDef);
      return iVar8;
    }
    if ((uVar2 != 0x4b) && (uVar2 != 0x77)) {
      if (uVar2 == 0x7a) {
        iVar8 = lookupName((Parse *)pList,_no_such_func,_is_agg,_nId,(NameContext *)zId,(Expr *)pDef
                          );
        return iVar8;
      }
      if (uVar2 == 0x87) {
        notValidCheckConstraint
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff74,0x87),
                   (NameContext *)
                   CONCAT44(in_stack_ffffffffffffff6c,
                            CONCAT13(in_stack_ffffffffffffff6b,
                                     CONCAT12(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)))
                   ,(char *)0x181946);
        notValidPartIdxWhere
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff74,uVar2),
                   (NameContext *)
                   CONCAT44(in_stack_ffffffffffffff6c,
                            CONCAT13(in_stack_ffffffffffffff6b,
                                     CONCAT12(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)))
                   ,(char *)0x18195c);
      }
      else if (uVar2 == 0x99) {
        pExpr_00 = *(Expr **)(in_RSI + 0x20);
        if (pExpr_00 == (Expr *)0x0) {
          iVar8 = 0;
        }
        else {
          iVar8._0_1_ = pExpr_00->op;
          iVar8._1_1_ = pExpr_00->affinity;
          iVar8._2_2_ = *(undefined2 *)&pExpr_00->field_0x2;
        }
        iVar11 = 0;
        bVar6 = false;
        bVar7 = false;
        uVar10 = pParse_00->db->enc;
        notValidPartIdxWhere
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff74,0x99),
                   (NameContext *)
                   CONCAT44(iVar8,CONCAT13(in_stack_ffffffffffffff6b,
                                           CONCAT12(in_stack_ffffffffffffff6a,
                                                    in_stack_ffffffffffffff68))),(char *)0x1814ec);
        z = *(char **)(in_RSI + 8);
        uVar3 = sqlite3Strlen30(z);
        zArg1 = sqlite3FindFunction(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                    (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                                    (int)in_stack_ffffffffffffffb8,(u8)((ulong)pExpr_00 >> 0x38),
                                    (u8)((ulong)pExpr_00 >> 0x30));
        if (zArg1 == (FuncDef *)0x0) {
          zArg1 = sqlite3FindFunction(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                      (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                                      (int)in_stack_ffffffffffffffb8,(u8)((ulong)pExpr_00 >> 0x38),
                                      (u8)((ulong)pExpr_00 >> 0x30));
          bVar6 = zArg1 != (FuncDef *)0x0;
          if (!bVar6) {
            iVar11 = 1;
          }
        }
        else {
          bVar7 = zArg1->xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
          if ((zArg1->funcFlags & 0x400) != 0) {
            *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x41000;
            if (iVar8 == 2) {
              iVar4 = exprProbability(in_stack_ffffffffffffff78);
              *(int *)(in_RSI + 0x2c) = iVar4;
              if (*(int *)(in_RSI + 0x2c) < 0) {
                sqlite3ErrorMsg(pParse_00,
                                "second argument to likelihood() must be a constant between 0.0 and 1.0"
                               );
                *(int *)((long)puVar1 + 0x2c) = *(int *)((long)puVar1 + 0x2c) + 1;
              }
            }
            else {
              uVar5 = 0x7800000;
              if (*zArg1->zName == 'u') {
                uVar5 = 0x800000;
              }
              *(undefined4 *)(in_RSI + 0x2c) = uVar5;
            }
          }
          iVar4 = sqlite3AuthCheck((Parse *)CONCAT44(in_stack_ffffffffffffff9c,uVar3),
                                   (int)((ulong)z >> 0x20),(char *)zArg1,
                                   (char *)CONCAT17(uVar10,in_stack_ffffffffffffff80),
                                   (char *)in_stack_ffffffffffffff78);
          if (iVar4 != 0) {
            if (iVar4 == 1) {
              sqlite3ErrorMsg(pParse_00,"not authorized to use function: %s",zArg1->zName);
              *(int *)((long)puVar1 + 0x2c) = *(int *)((long)puVar1 + 0x2c) + 1;
            }
            *in_RSI = 0x65;
            return 1;
          }
          if ((zArg1->funcFlags & 0x800) != 0) {
            *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x80000;
          }
        }
        if ((bVar7) && ((*(ushort *)(puVar1 + 6) & 1) == 0)) {
          sqlite3ErrorMsg(pParse_00,"misuse of aggregate function %.*s()",(ulong)uVar3,z);
          *(int *)((long)puVar1 + 0x2c) = *(int *)((long)puVar1 + 0x2c) + 1;
          bVar7 = false;
        }
        else if ((iVar11 == 0) || ((pParse_00->db->init).busy != '\0')) {
          if (bVar6) {
            sqlite3ErrorMsg(pParse_00,"wrong number of arguments to function %.*s()",(ulong)uVar3,z)
            ;
            *(int *)((long)puVar1 + 0x2c) = *(int *)((long)puVar1 + 0x2c) + 1;
          }
        }
        else {
          sqlite3ErrorMsg(pParse_00,"no such function: %.*s",(ulong)uVar3,z);
          *(int *)((long)puVar1 + 0x2c) = *(int *)((long)puVar1 + 0x2c) + 1;
        }
        if (bVar7) {
          *(ushort *)(puVar1 + 6) = *(ushort *)(puVar1 + 6) & 0xfffe;
        }
        sqlite3WalkExprList((Walker *)in_stack_ffffffffffffff78,
                            (ExprList *)CONCAT44(in_stack_ffffffffffffff74,uVar2));
        if (bVar7) {
          *in_RSI = 0x9b;
          in_RSI[0x36] = 0;
          puVar9 = puVar1;
          while( true ) {
            bVar7 = false;
            if (puVar9 != (undefined8 *)0x0) {
              iVar4 = sqlite3FunctionUsesThisSrc(pExpr_00,(SrcList *)CONCAT44(iVar8,iVar11));
              bVar7 = iVar4 == 0;
            }
            if (!bVar7) break;
            in_RSI[0x36] = in_RSI[0x36] + 1;
            puVar9 = (undefined8 *)puVar9[4];
          }
          if (puVar9 != (undefined8 *)0x0) {
            *(ushort *)(puVar9 + 6) = *(ushort *)(puVar9 + 6) | zArg1->funcFlags & 0x1000 | 2;
          }
          *(ushort *)(puVar1 + 6) = *(ushort *)(puVar1 + 6) | 1;
        }
        return 1;
      }
      goto LAB_0018195c;
    }
  }
  if ((*(uint *)(in_RSI + 4) & 0x800) != 0) {
    iVar8 = *(int *)(puVar1 + 5);
    notValidCheckConstraint
              ((Parse *)CONCAT44(iVar8,uVar2),
               (NameContext *)
               CONCAT44(in_stack_ffffffffffffff6c,
                        CONCAT13(in_stack_ffffffffffffff6b,
                                 CONCAT12(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68))),
               (char *)0x1818de);
    notValidPartIdxWhere
              ((Parse *)CONCAT44(iVar8,uVar2),
               (NameContext *)
               CONCAT44(in_stack_ffffffffffffff6c,
                        CONCAT13(in_stack_ffffffffffffff6b,
                                 CONCAT12(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68))),
               (char *)0x1818f4);
    sqlite3WalkSelect((Walker *)in_stack_ffffffffffffff78,(Select *)CONCAT44(iVar8,uVar2));
    if (iVar8 != *(int *)(puVar1 + 5)) {
      *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x20;
    }
  }
LAB_0018195c:
  bVar7 = true;
  if (pParse_00->nErr == 0) {
    bVar7 = pParse_00->db->mallocFailed != '\0';
  }
  local_4 = 0;
  if (bVar7) {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

  if( ExprHasProperty(pExpr, EP_Resolved) ) return WRC_Prune;
  ExprSetProperty(pExpr, EP_Resolved);
#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a; 
      pExpr->op = TK_COLUMN;
      pExpr->pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A lone identifier is the name of a column.
    */
    case TK_ID: {
      return lookupName(pParse, 0, 0, pExpr->u.zToken, pNC, pExpr);
    }
  
    /* A table name and column name:     ID.ID
    ** Or a database, table and column:  ID.ID.ID
    */
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      /* if( pSrcList==0 ) break; */
      pRight = pExpr->pRight;
      if( pRight->op==TK_ID ){
        zDb = 0;
        zTable = pExpr->pLeft->u.zToken;
        zColumn = pRight->u.zToken;
      }else{
        assert( pRight->op==TK_DOT );
        zDb = pExpr->pLeft->u.zToken;
        zTable = pRight->pLeft->u.zToken;
        zColumn = pRight->pRight->u.zToken;
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int auth;                   /* Authorization to use the function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      notValidPartIdxWhere(pParse, pNC, "functions");
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, nId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, nId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFunc==0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0, pDef->zName, 0);
        if( auth!=SQLITE_OK ){
          if( auth==SQLITE_DENY ){
            sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                    pDef->zName);
            pNC->nErr++;
          }
          pExpr->op = TK_NULL;
          return WRC_Prune;
        }
#endif
        if( pDef->funcFlags & SQLITE_FUNC_CONSTANT ){
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
      }
      if( is_agg && (pNC->ncFlags & NC_AllowAgg)==0 ){
        sqlite3ErrorMsg(pParse, "misuse of aggregate function %.*s()", nId,zId);
        pNC->nErr++;
        is_agg = 0;
      }else if( no_such_func && pParse->db->init.busy==0 ){
        sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
        pNC->nErr++;
      }else if( wrong_num_args ){
        sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
             nId, zId);
        pNC->nErr++;
      }
      if( is_agg ) pNC->ncFlags &= ~NC_AllowAgg;
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
        NameContext *pNC2 = pNC;
        pExpr->op = TK_AGG_FUNCTION;
        pExpr->op2 = 0;
        while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
          pExpr->op2++;
          pNC2 = pNC2->pNext;
        }
        assert( pDef!=0 );
        if( pNC2 ){
          assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
          testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
          pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

        }
        pNC->ncFlags |= NC_AllowAgg;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValidCheckConstraint(pParse, pNC, "subqueries");
        notValidPartIdxWhere(pParse, pNC, "subqueries");
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValidCheckConstraint(pParse, pNC, "parameters");
      notValidPartIdxWhere(pParse, pNC, "parameters");
      break;
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}